

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O3

string * get_all_kv_cache_types_abi_cxx11_(void)

{
  pointer pgVar1;
  char *pcVar2;
  size_t sVar3;
  string *psVar4;
  ggml_type *type;
  pointer pgVar5;
  ostringstream msg;
  undefined1 auStack_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pgVar1 = kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
      super__Vector_impl_data._M_start !=
      kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pgVar5 = kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pcVar2 = (char *)ggml_type_name(*pgVar5);
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x10);
      }
      else {
        sVar3 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
      }
      pcVar2 = ", ";
      if (pgVar5 == kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl
                    .super__Vector_impl_data._M_finish + -1) {
        pcVar2 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar2,
                 (ulong)((uint)(pgVar5 !=
                               kv_cache_types.
                               super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
                               super__Vector_impl_data._M_finish + -1) * 2));
      pgVar5 = pgVar5 + 1;
    } while (pgVar5 != pgVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar4 = (string *)std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

static std::string get_all_kv_cache_types() {
    std::ostringstream msg;
    for (const auto & type : kv_cache_types) {
        msg << ggml_type_name(type) << (&type == &kv_cache_types.back() ? "" : ", ");
    }
    return msg.str();
}